

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O2

void absl::lts_20250127::functional_internal::
     InvokeObject<absl::lts_20250127::cord_internal::CordRepBtree::CreateSlow(absl::lts_20250127::cord_internal::CordRep*)::__0,void,absl::lts_20250127::cord_internal::CordRep*,unsigned_long,unsigned_long>
               (VoidPtr ptr,type args,type_conflict4 args_1,type_conflict4 args_2)

{
  CordRep *rep;
  CordRepBtree *pCVar1;
  
  rep = cord_internal::anon_unknown_0::MakeSubstring(args,args_1,args_2);
  if ((CordRepBtree *)**ptr.obj == (CordRepBtree *)0x0) {
    pCVar1 = cord_internal::CordRepBtree::New(rep);
  }
  else {
    pCVar1 = cord_internal::CordRepBtree::
             AddCordRep<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                       ((CordRepBtree *)**ptr.obj,rep);
  }
  **ptr.obj = pCVar1;
  return;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}